

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.cpp
# Opt level: O0

void __thiscall
acto::actor::set_handler
          (actor *this,type_index *type,
          unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_> *h)

{
  bool bVar1;
  mapped_type *this_00;
  unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_> *h_local;
  type_index *type_local;
  actor *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)h);
  if (bVar1) {
    this_00 = std::
              unordered_map<std::type_index,_std::unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>_>_>_>
              ::operator[](&this->handlers_,type);
    std::unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>::operator=
              (this_00,h);
  }
  else {
    std::
    unordered_map<std::type_index,_std::unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>_>_>_>
    ::erase(&this->handlers_,type);
  }
  return;
}

Assistant:

void actor::set_handler(const std::type_index& type,
                        std::unique_ptr<handler_t> h) {
  if (h) {
    handlers_[type] = std::move(h);
  } else {
    handlers_.erase(type);
  }
}